

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

void __thiscall
xLearn::LibsvmParser::Parse(LibsvmParser *this,char *buf,uint64 size,DMatrix *matrix,bool reset)

{
  undefined1 auVar1 [16];
  byte bVar2;
  index_t feat_id;
  uint64 uVar3;
  char *pcVar4;
  char *pcVar5;
  ostream *poVar6;
  DMatrix *this_00;
  index_t row_id;
  double dVar7;
  allocator local_9e;
  allocator local_9d;
  float local_9c;
  Logger local_98;
  float local_94;
  uint64 local_90;
  long local_88;
  uint64 local_80;
  char *local_78;
  string local_70;
  string local_50;
  
  local_78 = buf;
  if (buf == (char *)0x0) {
    local_98.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,&local_9d);
    std::__cxx11::string::string((string *)&local_70,"Parse",&local_9e);
    poVar6 = Logger::Start(ERR,&local_50,0x4c,&local_70);
    poVar6 = std::operator<<(poVar6,"CHECK failed ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4c);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"buf");
    std::operator<<(poVar6," == NULL \n");
  }
  else {
    if (size != 0) {
      this_00 = (DMatrix *)this;
      if (reset) {
        this_00 = matrix;
        DMatrix::Reset(matrix);
      }
      local_90 = 0;
      local_80 = size;
      while( true ) {
        uVar3 = Parser::get_line_from_buffer((Parser *)this_00,line_buf,local_78,local_90,local_80);
        if (uVar3 == 0) break;
        DMatrix::AddRow(matrix);
        bVar2 = (this->super_Parser).has_label_;
        row_id = matrix->row_length - 1;
        local_88 = (long)(int)row_id;
        if ((bool)bVar2 == true) {
          pcVar4 = strtok(line_buf,(this->super_Parser).splitor_._M_dataplus._M_p);
          dVar7 = atof(pcVar4);
          (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_88] = (float)dVar7;
          bVar2 = (this->super_Parser).has_label_;
        }
        else {
          (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start[local_88] = -2.0;
        }
        local_9c = 0.0;
        if ((bVar2 & 1) == 0) {
          pcVar4 = strtok(line_buf,":");
          pcVar5 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
          if ((pcVar4 != (char *)0x0) && (*pcVar4 != '\n')) {
            local_94 = (float)atoi(pcVar4);
            dVar7 = atof(pcVar5);
            local_9c = (float)dVar7;
            DMatrix::AddNode(matrix,row_id,(index_t)local_94,local_9c,0);
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)local_9c),ZEXT416((uint)local_9c),ZEXT416(0));
            local_9c = auVar1._0_4_;
          }
        }
        local_90 = local_90 + uVar3;
        while( true ) {
          pcVar4 = strtok((char *)0x0,":");
          this_00 = (DMatrix *)0x0;
          pcVar5 = strtok((char *)0x0,(this->super_Parser).splitor_._M_dataplus._M_p);
          if ((pcVar4 == (char *)0x0) || (*pcVar4 == '\n')) break;
          feat_id = atoi(pcVar4);
          dVar7 = atof(pcVar5);
          local_94 = (float)dVar7;
          DMatrix::AddNode(matrix,row_id,feat_id,local_94,0);
          auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_9c),ZEXT416((uint)local_94),
                                   ZEXT416((uint)local_94));
          local_9c = auVar1._0_4_;
        }
        (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[local_88] = 1.0 / local_9c;
      }
      return;
    }
    local_98.severity_ = ERR;
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
               ,&local_9d);
    std::__cxx11::string::string((string *)&local_70,"Parse",&local_9e);
    poVar6 = Logger::Start(ERR,&local_50,0x4d,&local_70);
    poVar6 = std::operator<<(poVar6,"CHECK_GT failed ");
    poVar6 = std::operator<<(poVar6,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/reader/parser.cc"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x4d);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"size");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,"0");
    poVar6 = std::operator<<(poVar6," = ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0);
    std::operator<<(poVar6,"\n");
  }
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  Logger::~Logger(&local_98);
  abort();
}

Assistant:

void LibsvmParser::Parse(char* buf, 
                         uint64 size, 
                         DMatrix& matrix, 
                         bool reset) {
  CHECK_NOTNULL(buf);
  CHECK_GT(size, 0);
  // Clear the data matrix
  if (reset) { 
    matrix.Reset(); 
  }
  // Parse every line
  uint64 pos = 0;
  for (;;) {
    uint64 rd_size = get_line_from_buffer(line_buf, buf, pos, size);
    if (rd_size == 0) break;
    pos += rd_size;
    matrix.AddRow();
    int i = matrix.row_length - 1;
    if (reset == false) {
    }
    // Add Y
    if (has_label_) {  // for training task
      char *y_char = strtok(line_buf, splitor_.c_str());
      matrix.Y[i] = atof(y_char);
    } else {  // for predict task
      matrix.Y[i] = -2;
    }
    // Add features
    real_t norm = 0.0;
    // The first element
    if (!has_label_) {
      char *idx_char = strtok(line_buf, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char != nullptr && *idx_char != '\n') {
        index_t idx = atoi(idx_char);
        real_t value = atof(value_char);
        matrix.AddNode(i, idx, value);
        norm += value*value;
      }
    }
    // The remain elements
    for (;;) {
      char *idx_char = strtok(nullptr, ":");
      char *value_char = strtok(nullptr, splitor_.c_str());
      if (idx_char == nullptr || *idx_char == '\n') {
        break;
      }
      index_t idx = atoi(idx_char);
      real_t value = atof(value_char);
      matrix.AddNode(i, idx, value);
      norm += value*value;
    }
    norm = 1.0f / norm;
    matrix.norm[i] = norm;
  }
}